

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Kinematics.cc
# Opt level: O0

uint __thiscall
RigidBodyDynamics::InverseKinematicsConstraintSet::AddOrientationConstraint
          (InverseKinematicsConstraintSet *this,uint body_id,Matrix3d *target_orientation,
          float weight)

{
  size_type sVar1;
  value_type *in_RDI;
  value_type *in_stack_ffffffffffffff78;
  MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  *other;
  Vector3_t *in_stack_ffffffffffffff80;
  double *this_00;
  vector<Matrix3_t,_std::allocator<Matrix3_t>_> *in_stack_ffffffffffffff90;
  
  std::
  vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
  ::push_back((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
               *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90,
             (value_type_conflict *)in_RDI);
  other = (MatrixBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
           *)(in_RDI[2].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
              m_storage.m_data.array + 3);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (in_stack_ffffffffffffff80,other);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)in_stack_ffffffffffffff80,
             (value_type *)other);
  this_00 = in_RDI[2].super_Matrix3d.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
            m_storage.m_data.array + 6;
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Vector3_t::
  Vector3_t<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Vector3_t *)this_00,other);
  std::vector<Vector3_t,_std::allocator<Vector3_t>_>::push_back
            ((vector<Vector3_t,_std::allocator<Vector3_t>_> *)this_00,(value_type *)other);
  std::vector<Matrix3_t,_std::allocator<Matrix3_t>_>::push_back(in_stack_ffffffffffffff90,in_RDI);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
            ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)in_stack_ffffffffffffff90,
             (value_type_conflict *)in_RDI);
  std::vector<float,_std::allocator<float>_>::push_back
            ((vector<float,_std::allocator<float>_> *)in_stack_ffffffffffffff90,
             (value_type_conflict3 *)in_RDI);
  *(int *)((in_RDI->super_Matrix3d).super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
           m_storage.m_data.array + 8) =
       *(int *)((in_RDI->super_Matrix3d).
                super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.array
               + 8) + 3;
  sVar1 = std::
          vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
          ::size((vector<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType,_std::allocator<RigidBodyDynamics::InverseKinematicsConstraintSet::ConstraintType>_>
                  *)(in_RDI[1].super_Matrix3d.
                     super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                     array + 6));
  return (int)sVar1 - 1;
}

Assistant:

RBDL_DLLAPI
unsigned int InverseKinematicsConstraintSet::AddOrientationConstraint(
    unsigned int body_id,
    const Matrix3d& target_orientation,
    float weight
    ) {
  constraint_type.push_back (ConstraintTypeOrientation);
  body_ids.push_back(body_id);
  body_points.push_back(Vector3d::Zero());
  target_positions.push_back(Vector3d::Zero());
  target_orientations.push_back(target_orientation);
  constraint_row_index.push_back(num_constraints);
  constraint_weight.push_back(weight);
  num_constraints = num_constraints + 3;
  return constraint_type.size() - 1;
}